

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O0

bool __thiscall
cmLocalUnixMakefileGenerator3::ScanDependencies
          (cmLocalUnixMakefileGenerator3 *this,string *targetDir,string *dependFile,
          string *internalDependFile,DependencyMap *validDeps)

{
  cmMakefile *this_00;
  bool bVar1;
  byte bVar2;
  Encoding EVar3;
  string *psVar4;
  char *pcVar5;
  ostream *poVar6;
  pointer pcVar7;
  cmake *this_01;
  cmFileTimeCache *fc;
  unique_ptr<cmDependsJava,_std::default_delete<cmDependsJava>_> local_6b0;
  cmLocalUnixMakefileGenerator3 *local_6a8;
  unique_ptr<cmDependsFortran,_std::default_delete<cmDependsFortran>_> local_6a0;
  DependencyMap *local_698;
  cmLocalUnixMakefileGenerator3 *local_690;
  unique_ptr<cmDependsC,_std::default_delete<cmDependsC>_> local_688;
  unique_ptr<cmDepends,_std::default_delete<cmDepends>_> local_680;
  unique_ptr<cmDepends,_std::default_delete<cmDepends>_> scanner;
  string *lang;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  string local_650;
  undefined1 local_630 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  langs;
  cmGeneratedFileStream internalRuleFileStream;
  undefined1 local_3c8 [8];
  cmGeneratedFileStream ruleFileStream;
  string local_178;
  cmStateDirectory local_158;
  allocator<char> local_129;
  string local_128;
  char *local_108;
  char *relativePathTopBinary;
  allocator<char> local_d1;
  string local_d0;
  char *local_b0;
  char *relativePathTopSource;
  string local_a0;
  char *local_80;
  char *force;
  undefined1 local_68 [8];
  string dirInfoFile;
  bool haveDirectoryInfo;
  cmMakefile *mf;
  DependencyMap *validDeps_local;
  string *internalDependFile_local;
  string *dependFile_local;
  string *targetDir_local;
  cmLocalUnixMakefileGenerator3 *this_local;
  
  this_00 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
  dirInfoFile.field_2._M_local_buf[0xf] = '\0';
  psVar4 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_((cmLocalGenerator *)this);
  std::__cxx11::string::string((string *)local_68,(string *)psVar4);
  std::__cxx11::string::operator+=((string *)local_68,"/CMakeFiles");
  std::__cxx11::string::operator+=((string *)local_68,"/CMakeDirectoryInformation.cmake");
  bVar1 = cmMakefile::ReadListFile(this_00,(string *)local_68);
  if ((bVar1) && (bVar1 = cmSystemTools::GetErrorOccuredFlag(), !bVar1)) {
    dirInfoFile.field_2._M_local_buf[0xf] = '\x01';
  }
  std::__cxx11::string::~string((string *)local_68);
  if ((dirInfoFile.field_2._M_local_buf[0xf] & 1U) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_178,"Directory Information file not found",
               (allocator<char> *)&ruleFileStream.field_0x247);
    cmSystemTools::Error(&local_178);
    std::__cxx11::string::~string((string *)&local_178);
    std::allocator<char>::~allocator((allocator<char> *)&ruleFileStream.field_0x247);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a0,"CMAKE_FORCE_UNIX_PATHS",
               (allocator<char> *)((long)&relativePathTopSource + 7));
    pcVar5 = cmMakefile::GetDefinition(this_00,&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    std::allocator<char>::~allocator((allocator<char> *)((long)&relativePathTopSource + 7));
    local_80 = pcVar5;
    if ((pcVar5 != (char *)0x0) && (bVar1 = cmSystemTools::IsOff(pcVar5), !bVar1)) {
      cmSystemTools::SetForceUnixPaths(true);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d0,"CMAKE_RELATIVE_PATH_TOP_SOURCE",&local_d1);
    pcVar5 = cmMakefile::GetDefinition(this_00,&local_d0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::allocator<char>::~allocator(&local_d1);
    local_b0 = pcVar5;
    if (pcVar5 != (char *)0x0) {
      cmStateSnapshot::GetDirectory
                ((cmStateDirectory *)&relativePathTopBinary,
                 &(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.StateSnapshot);
      cmStateDirectory::SetRelativePathTopSource
                ((cmStateDirectory *)&relativePathTopBinary,local_b0);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_128,"CMAKE_RELATIVE_PATH_TOP_BINARY",&local_129);
    pcVar5 = cmMakefile::GetDefinition(this_00,&local_128);
    std::__cxx11::string::~string((string *)&local_128);
    std::allocator<char>::~allocator(&local_129);
    local_108 = pcVar5;
    if (pcVar5 != (char *)0x0) {
      cmStateSnapshot::GetDirectory
                (&local_158,
                 &(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.StateSnapshot);
      cmStateDirectory::SetRelativePathTopBinary(&local_158,local_108);
    }
  }
  EVar3 = (*((this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator)->
            _vptr_cmGlobalGenerator[5])();
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)local_3c8,dependFile,false,EVar3);
  cmGeneratedFileStream::SetCopyIfDifferent((cmGeneratedFileStream *)local_3c8,true);
  bVar2 = std::ios::operator!((ios *)(local_3c8 + (long)*(_func_int **)((long)local_3c8 + -0x18)));
  if ((bVar2 & 1) == 0) {
    EVar3 = (*((this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator)->
              _vptr_cmGlobalGenerator[5])();
    cmGeneratedFileStream::cmGeneratedFileStream
              ((cmGeneratedFileStream *)
               &langs.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,internalDependFile,false,EVar3);
    bVar2 = std::ios::operator!((ios *)((long)&langs.
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_end_of_storage +
                                       langs.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage[-1].
                                       _M_string_length));
    if ((bVar2 & 1) == 0) {
      WriteDisclaimer(this,(ostream *)local_3c8);
      WriteDisclaimer(this,(ostream *)
                           &langs.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_630);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_650,"CMAKE_DEPENDS_LANGUAGES",
                 (allocator<char> *)((long)&__range1 + 7));
      psVar4 = cmMakefile::GetSafeDefinition(this_00,&local_650);
      cmSystemTools::ExpandListArgument
                (psVar4,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_630,false);
      std::__cxx11::string::~string((string *)&local_650);
      std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 7));
      __end1 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_630);
      lang = (string *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_630);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         *)&lang), bVar1) {
        scanner._M_t.super___uniq_ptr_impl<cmDepends,_std::default_delete<cmDepends>_>._M_t.
        super__Tuple_impl<0UL,_cmDepends_*,_std::default_delete<cmDepends>_>.
        super__Head_base<0UL,_cmDepends_*,_false>._M_head_impl =
             (__uniq_ptr_data<cmDepends,_std::default_delete<cmDepends>,_true,_true>)
             __gnu_cxx::
             __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&__end1);
        std::unique_ptr<cmDepends,std::default_delete<cmDepends>>::
        unique_ptr<std::default_delete<cmDepends>,void>
                  ((unique_ptr<cmDepends,std::default_delete<cmDepends>> *)&local_680);
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )scanner._M_t.
                                 super___uniq_ptr_impl<cmDepends,_std::default_delete<cmDepends>_>.
                                 _M_t.
                                 super__Tuple_impl<0UL,_cmDepends_*,_std::default_delete<cmDepends>_>
                                 .super__Head_base<0UL,_cmDepends_*,_false>._M_head_impl,"C");
        if ((((bVar1) ||
             (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)scanner._M_t.
                                         super___uniq_ptr_impl<cmDepends,_std::default_delete<cmDepends>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_cmDepends_*,_std::default_delete<cmDepends>_>
                                         .super__Head_base<0UL,_cmDepends_*,_false>._M_head_impl,
                                      "CXX"), bVar1)) ||
            (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)scanner._M_t.
                                        super___uniq_ptr_impl<cmDepends,_std::default_delete<cmDepends>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_cmDepends_*,_std::default_delete<cmDepends>_>
                                        .super__Head_base<0UL,_cmDepends_*,_false>._M_head_impl,"RC"
                                    ), bVar1)) ||
           ((bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)scanner._M_t.
                                        super___uniq_ptr_impl<cmDepends,_std::default_delete<cmDepends>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_cmDepends_*,_std::default_delete<cmDepends>_>
                                        .super__Head_base<0UL,_cmDepends_*,_false>._M_head_impl,
                                     "ASM"), bVar1 ||
            (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)scanner._M_t.
                                        super___uniq_ptr_impl<cmDepends,_std::default_delete<cmDepends>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_cmDepends_*,_std::default_delete<cmDepends>_>
                                        .super__Head_base<0UL,_cmDepends_*,_false>._M_head_impl,
                                     "CUDA"), bVar1)))) {
          local_698 = validDeps;
          local_690 = this;
          std::
          make_unique<cmDependsC,cmLocalUnixMakefileGenerator3*,std::__cxx11::string_const&,std::__cxx11::string_const&,std::map<std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>*>
                    ((cmLocalUnixMakefileGenerator3 **)&local_688,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_690
                     ,targetDir,
                     (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                      **)scanner._M_t.
                         super___uniq_ptr_impl<cmDepends,_std::default_delete<cmDepends>_>._M_t.
                         super__Tuple_impl<0UL,_cmDepends_*,_std::default_delete<cmDepends>_>.
                         super__Head_base<0UL,_cmDepends_*,_false>._M_head_impl);
          std::unique_ptr<cmDepends,std::default_delete<cmDepends>>::operator=
                    ((unique_ptr<cmDepends,std::default_delete<cmDepends>> *)&local_680,&local_688);
          std::unique_ptr<cmDependsC,_std::default_delete<cmDependsC>_>::~unique_ptr(&local_688);
        }
        else {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)scanner._M_t.
                                     super___uniq_ptr_impl<cmDepends,_std::default_delete<cmDepends>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_cmDepends_*,_std::default_delete<cmDepends>_>
                                     .super__Head_base<0UL,_cmDepends_*,_false>._M_head_impl,
                                  "Fortran");
          if (bVar1) {
            poVar6 = std::operator<<((ostream *)local_3c8,
                                     "# Note that incremental build could trigger ");
            std::operator<<(poVar6,"a call to cmake_copy_f90_mod on each re-build\n");
            local_6a8 = this;
            std::make_unique<cmDependsFortran,cmLocalUnixMakefileGenerator3*>
                      ((cmLocalUnixMakefileGenerator3 **)&local_6a0);
            std::unique_ptr<cmDepends,std::default_delete<cmDepends>>::operator=
                      ((unique_ptr<cmDepends,std::default_delete<cmDepends>> *)&local_680,&local_6a0
                      );
            std::unique_ptr<cmDependsFortran,_std::default_delete<cmDependsFortran>_>::~unique_ptr
                      (&local_6a0);
          }
          else {
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)scanner._M_t.
                                       super___uniq_ptr_impl<cmDepends,_std::default_delete<cmDepends>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_cmDepends_*,_std::default_delete<cmDepends>_>
                                       .super__Head_base<0UL,_cmDepends_*,_false>._M_head_impl,
                                    "Java");
            if (bVar1) {
              std::make_unique<cmDependsJava>();
              std::unique_ptr<cmDepends,std::default_delete<cmDepends>>::operator=
                        ((unique_ptr<cmDepends,std::default_delete<cmDepends>> *)&local_680,
                         &local_6b0);
              std::unique_ptr<cmDependsJava,_std::default_delete<cmDependsJava>_>::~unique_ptr
                        (&local_6b0);
            }
          }
        }
        bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_680);
        if (bVar1) {
          pcVar7 = std::unique_ptr<cmDepends,_std::default_delete<cmDepends>_>::operator->
                             (&local_680);
          cmDepends::SetLocalGenerator(pcVar7,(cmLocalGenerator *)this);
          pcVar7 = std::unique_ptr<cmDepends,_std::default_delete<cmDepends>_>::operator->
                             (&local_680);
          this_01 = cmGlobalGenerator::GetCMakeInstance
                              ((this->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                               GlobalGenerator);
          fc = cmake::GetFileTimeCache(this_01);
          cmDepends::SetFileTimeCache(pcVar7,fc);
          pcVar7 = std::unique_ptr<cmDepends,_std::default_delete<cmDepends>_>::operator->
                             (&local_680);
          cmDepends::SetLanguage
                    (pcVar7,(string *)
                            scanner._M_t.
                            super___uniq_ptr_impl<cmDepends,_std::default_delete<cmDepends>_>._M_t.
                            super__Tuple_impl<0UL,_cmDepends_*,_std::default_delete<cmDepends>_>.
                            super__Head_base<0UL,_cmDepends_*,_false>._M_head_impl);
          pcVar7 = std::unique_ptr<cmDepends,_std::default_delete<cmDepends>_>::operator->
                             (&local_680);
          cmDepends::SetTargetDirectory(pcVar7,targetDir);
          pcVar7 = std::unique_ptr<cmDepends,_std::default_delete<cmDepends>_>::operator->
                             (&local_680);
          cmDepends::Write(pcVar7,(ostream *)local_3c8,
                           (ostream *)
                           &langs.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
        }
        std::unique_ptr<cmDepends,_std::default_delete<cmDepends>_>::~unique_ptr(&local_680);
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end1);
      }
      this_local._7_1_ = true;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_630);
    }
    else {
      this_local._7_1_ = false;
    }
    cmGeneratedFileStream::~cmGeneratedFileStream
              ((cmGeneratedFileStream *)
               &langs.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  else {
    this_local._7_1_ = false;
  }
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_3c8);
  return this_local._7_1_;
}

Assistant:

bool cmLocalUnixMakefileGenerator3::ScanDependencies(
  std::string const& targetDir, std::string const& dependFile,
  std::string const& internalDependFile, cmDepends::DependencyMap& validDeps)
{
  // Read the directory information file.
  cmMakefile* mf = this->Makefile;
  bool haveDirectoryInfo = false;
  {
    std::string dirInfoFile = this->GetCurrentBinaryDirectory();
    dirInfoFile += "/CMakeFiles";
    dirInfoFile += "/CMakeDirectoryInformation.cmake";
    if (mf->ReadListFile(dirInfoFile) &&
        !cmSystemTools::GetErrorOccuredFlag()) {
      haveDirectoryInfo = true;
    }
  }

  // Lookup useful directory information.
  if (haveDirectoryInfo) {
    // Test whether we need to force Unix paths.
    if (const char* force = mf->GetDefinition("CMAKE_FORCE_UNIX_PATHS")) {
      if (!cmSystemTools::IsOff(force)) {
        cmSystemTools::SetForceUnixPaths(true);
      }
    }

    // Setup relative path top directories.
    if (const char* relativePathTopSource =
          mf->GetDefinition("CMAKE_RELATIVE_PATH_TOP_SOURCE")) {
      this->StateSnapshot.GetDirectory().SetRelativePathTopSource(
        relativePathTopSource);
    }
    if (const char* relativePathTopBinary =
          mf->GetDefinition("CMAKE_RELATIVE_PATH_TOP_BINARY")) {
      this->StateSnapshot.GetDirectory().SetRelativePathTopBinary(
        relativePathTopBinary);
    }
  } else {
    cmSystemTools::Error("Directory Information file not found");
  }

  // Open the make depends file.  This should be copy-if-different
  // because the make tool may try to reload it needlessly otherwise.
  cmGeneratedFileStream ruleFileStream(
    dependFile, false, this->GlobalGenerator->GetMakefileEncoding());
  ruleFileStream.SetCopyIfDifferent(true);
  if (!ruleFileStream) {
    return false;
  }

  // Open the cmake dependency tracking file.  This should not be
  // copy-if-different because dependencies are re-scanned when it is
  // older than the DependInfo.cmake.
  cmGeneratedFileStream internalRuleFileStream(
    internalDependFile, false, this->GlobalGenerator->GetMakefileEncoding());
  if (!internalRuleFileStream) {
    return false;
  }

  this->WriteDisclaimer(ruleFileStream);
  this->WriteDisclaimer(internalRuleFileStream);

  // for each language we need to scan, scan it
  std::vector<std::string> langs;
  cmSystemTools::ExpandListArgument(
    mf->GetSafeDefinition("CMAKE_DEPENDS_LANGUAGES"), langs);
  for (std::string const& lang : langs) {
    // construct the checker
    // Create the scanner for this language
    std::unique_ptr<cmDepends> scanner;
    if (lang == "C" || lang == "CXX" || lang == "RC" || lang == "ASM" ||
        lang == "CUDA") {
      // TODO: Handle RC (resource files) dependencies correctly.
      scanner = cm::make_unique<cmDependsC>(this, targetDir, lang, &validDeps);
    }
#ifdef CMAKE_BUILD_WITH_CMAKE
    else if (lang == "Fortran") {
      ruleFileStream << "# Note that incremental build could trigger "
                     << "a call to cmake_copy_f90_mod on each re-build\n";
      scanner = cm::make_unique<cmDependsFortran>(this);
    } else if (lang == "Java") {
      scanner = cm::make_unique<cmDependsJava>();
    }
#endif

    if (scanner) {
      scanner->SetLocalGenerator(this);
      scanner->SetFileTimeCache(
        this->GlobalGenerator->GetCMakeInstance()->GetFileTimeCache());
      scanner->SetLanguage(lang);
      scanner->SetTargetDirectory(targetDir);
      scanner->Write(ruleFileStream, internalRuleFileStream);
    }
  }

  return true;
}